

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::Append
          (BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *this,
          UnifiedVectorFormat *vdata,idx_t count)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool is_valid;
  idx_t row_idx;
  idx_t i;
  idx_t iVar5;
  uhugeint_t value;
  
  pdVar1 = vdata->data;
  for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
    psVar2 = vdata->sel->sel_vector;
    row_idx = iVar5;
    if (psVar2 != (sel_t *)0x0) {
      row_idx = (idx_t)psVar2[iVar5];
    }
    uVar3 = *(uint64_t *)(pdVar1 + row_idx * 0x10);
    uVar4 = *(uint64_t *)(pdVar1 + row_idx * 0x10 + 8);
    is_valid = TemplatedValidityMask<unsigned_long>::RowIsValid
                         (&(vdata->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    value.upper = uVar4;
    value.lower = uVar3;
    BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t>::
    Update<duckdb::BitpackingCompressionState<duckdb::uhugeint_t,true,duckdb::hugeint_t>::BitpackingWriter>
              ((BitpackingState<duckdb::uhugeint_t,duckdb::hugeint_t> *)&this->state,value,is_valid)
    ;
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);

		for (idx_t i = 0; i < count; i++) {
			idx_t idx = vdata.sel->get_index(i);
			state.template Update<BitpackingCompressionState<T, WRITE_STATISTICS, T_S>::BitpackingWriter>(
			    data[idx], vdata.validity.RowIsValid(idx));
		}
	}